

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conn.c
# Opt level: O0

void conn_get_remote_addr(conn_handle *conn,char *dest)

{
  void *pvVar1;
  size_t sVar2;
  char *pcVar3;
  sockaddr_in6 *addr6;
  sockaddr_in *addr;
  conn_priv *priv;
  char *dest_local;
  conn_handle *conn_local;
  
  pvVar1 = conn->priv;
  if (*(short *)((long)pvVar1 + 0x10) == 2) {
    inet_ntop((uint)*(ushort *)((long)pvVar1 + 0x10),(void *)((long)pvVar1 + 0x14),dest,0x2e);
    sVar2 = strlen(dest);
    dest[sVar2] = ':';
    conn_port_to_str(*(uint16_t *)((long)pvVar1 + 0x12),dest + sVar2 + 1);
  }
  else if (*(short *)((long)pvVar1 + 0x10) == 10) {
    *dest = '[';
    inet_ntop((uint)*(ushort *)((long)pvVar1 + 0x10),(void *)((long)pvVar1 + 0x18),dest + 1,0x2e);
    sVar2 = strlen(dest);
    pcVar3 = dest + sVar2;
    *pcVar3 = ']';
    pcVar3[1] = ':';
    conn_port_to_str(*(uint16_t *)((long)pvVar1 + 0x12),pcVar3 + 2);
  }
  else {
    strcpy(dest,"(unknown)");
  }
  return;
}

Assistant:

void conn_get_remote_addr(const struct conn_handle *conn, char dest[54])
{
	const struct conn_priv *priv = conn->priv;
	const struct sockaddr_in *addr = (const struct sockaddr_in *)&priv->remote_addr;
	const struct sockaddr_in6 *addr6 = (const struct sockaddr_in6 *)&priv->remote_addr;

	switch (priv->remote_addr.ss_family) {
	case AF_INET:
		inet_ntop(addr->sin_family, &addr->sin_addr.s_addr, dest, 46);
		dest += strlen(dest);
		dest[0] = ':';
		conn_port_to_str(addr->sin_port, dest + 1);
		break;
	case AF_INET6:
		dest[0] = '[';
		inet_ntop(addr6->sin6_family, &addr6->sin6_addr.s6_addr,
			  dest + 1, 46);
		dest += strlen(dest);
		dest[0] = ']';
		dest[1] = ':';
		conn_port_to_str(addr6->sin6_port, dest + 2);
		break;
	default:
		strcpy(dest, "(unknown)");
		break;
	}
}